

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_base.h
# Opt level: O1

Ptr __thiscall core::TypedImageBase<double>::duplicate_base(TypedImageBase<double> *this)

{
  undefined8 uVar1;
  TypedImageBase<double> *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Ptr PVar2;
  
  __p = (TypedImageBase<double> *)operator_new(0x30);
  (__p->super_ImageBase)._vptr_ImageBase = (_func_int **)&PTR__ImageBase_0012fbf8;
  uVar1 = *(undefined8 *)(in_RSI + 8);
  (__p->super_ImageBase).w = (int)uVar1;
  (__p->super_ImageBase).h = (int)((ulong)uVar1 >> 0x20);
  (__p->super_ImageBase).c = *(int *)(in_RSI + 0x10);
  (__p->super_ImageBase)._vptr_ImageBase = (_func_int **)&PTR__TypedImageBase_001308e8;
  std::vector<double,_std::allocator<double>_>::vector
            (&__p->data,(vector<double,_std::allocator<double>_> *)(in_RSI + 0x18));
  (this->super_ImageBase)._vptr_ImageBase = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::TypedImageBase<double>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_ImageBase).w,__p);
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ImageBase;
  return (Ptr)PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ImageBase::Ptr
TypedImageBase<T>::duplicate_base (void) const
{
    return ImageBase::Ptr(new TypedImageBase<T>(*this));
}